

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void testing::internal::PrintFullTestCommentIfPresent(TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  pbVar1 = (test_info->type_param_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = (pointer)0x0;
  }
  else {
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
  }
  pbVar1 = (test_info->value_param_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
  }
  if (pcVar3 != (pointer)0x0 || pcVar2 != (pointer)0x0) {
    printf(", where ");
    if (pcVar3 != (pointer)0x0) {
      printf("%s = %s","TypeParam",pcVar3);
      if (pcVar2 == (pointer)0x0) {
        return;
      }
      printf(" and ");
    }
    if (pcVar2 != (pointer)0x0) {
      printf("%s = %s","GetParam()",pcVar2);
      return;
    }
  }
  return;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}